

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O2

client * workspace_list_find_window_client(workspace_list *list,xcb_window_t window)

{
  size_t sVar1;
  client *pcVar2;
  size_t i;
  size_t sVar3;
  
  sVar1 = list->count;
  sVar3 = 0;
  do {
    if (sVar1 == sVar3) {
      return (client *)0x0;
    }
    pcVar2 = workspace_find_window_client(list->workspaces[sVar3],window);
    sVar3 = sVar3 + 1;
  } while (pcVar2 == (client *)0x0);
  return pcVar2;
}

Assistant:

struct client *workspace_list_find_window_client(const struct workspace_list *list,
                                                 xcb_window_t window)
{
        for (size_t i = 0; i < list->count; ++i) {
                struct workspace *workspace = list->workspaces[i];
                struct client *client = workspace_find_window_client(workspace, window);

                if (client != NULL) {
                        return client;
                }
        }

        return NULL;
}